

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdrive.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *perm_r_00;
  int *perm_c_00;
  int *addr;
  bool bVar2;
  int *mode_00;
  void **B_00;
  float *pfVar3;
  singlecomplex *psVar4;
  singlecomplex **cond;
  SuperLUStat_t *stat_00;
  float *pfVar5;
  void *pvVar6;
  undefined8 uVar7;
  bool local_949;
  bool local_935;
  int local_934;
  int local_92c;
  int local_928;
  int local_920;
  int local_91c;
  char local_918 [8];
  char msg_4 [256];
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  int iseed [4];
  FILE *local_400;
  FILE *fp;
  SuperLUStat_t stat;
  trans_t trans;
  fact_t fact;
  superlu_options_t options;
  float result [5];
  singlecomplex *Afull;
  float cndnum;
  float anorm;
  double u;
  uint local_300;
  int izero;
  int zerot;
  int ioff;
  int lda;
  int mode;
  int ku;
  int kl;
  int itran;
  int ifact;
  int nfact;
  int nimat;
  int fimat;
  int imat;
  int nerrs;
  int nfail;
  int nrun;
  int nt;
  int iequed;
  int equil;
  int prefact;
  int colblk;
  int rowblk;
  int maxsuper;
  float amax;
  float colcnd;
  float rowcnd;
  int k1;
  int j;
  int i;
  float rcond;
  float rpg;
  int ldx;
  int ldb;
  singlecomplex *bsav;
  singlecomplex *solx;
  singlecomplex *rhsb;
  singlecomplex *xact;
  int_t local_258;
  int_t info;
  int_t lwork;
  int_t nnz;
  int info1;
  int n;
  int m;
  int relax;
  int panel_size;
  int nrhs;
  void *work;
  singlecomplex *wwork;
  float *rwork;
  float *berr;
  float *ferr;
  float *C;
  float *R;
  singlecomplex zero;
  int *etree;
  int *pc_save;
  int *perm_c;
  int *perm_r;
  mem_usage_t mem_usage;
  GlobalLU_t Glu;
  SuperMatrix AC;
  SuperMatrix ASAV;
  SuperMatrix U;
  SuperMatrix L;
  SuperMatrix X;
  SuperMatrix B;
  SuperMatrix A;
  int_t *xa_save;
  int_t *xa;
  int_t *asub_save;
  int_t *asub;
  singlecomplex *a_save;
  singlecomplex *a;
  char **argv_local;
  int argc_local;
  undefined4 uVar8;
  
  argv_local._4_4_ = 0;
  a = (singlecomplex *)argv;
  argv_local._0_4_ = argc;
  memset(&R,0,8);
  _panel_size = (void *)0x0;
  msg[0xf8] = -0x3c;
  msg[0xf9] = '\a';
  msg[0xfa] = '\0';
  msg[0xfb] = '\0';
  msg[0xfc] = -0x3b;
  msg[0xfd] = '\a';
  msg[0xfe] = '\0';
  msg[0xff] = '\0';
  strcpy(main::path,"CGE");
  nerrs = 0;
  imat = 0;
  fimat = 0;
  local_258 = 0;
  nnz = 1;
  relax = 1;
  m = sp_ienv(1);
  n = sp_ienv(2);
  _cndnum = 1.0;
  strcpy(main::matrix_type,"LA");
  parse_command_line((int)argv_local,(char **)a,main::matrix_type,&nnz,&m,&n,&relax,&colblk,&prefact
                     ,&equil,&local_258,(double *)&cndnum,&local_400);
  if ((0 < local_258) && (_panel_size = superlu_malloc((long)local_258), _panel_size == (void *)0x0)
     ) {
    fprintf(_stderr,"expert: cannot allocate %lld bytes\n",(long)local_258);
    exit(-1);
  }
  set_default_options((superlu_options_t *)&trans);
  options._16_8_ = _cndnum;
  options.SolveInitialized = NO;
  options.DiagPivotThresh._4_4_ = 1;
  options.SymmetricMode = YES;
  options.ColPerm = MMD_ATA;
  iVar1 = strcmp(main::matrix_type,"LA");
  if (iVar1 == 0) {
    info1 = nnz;
    if (nnz < 2) {
      local_91c = 1;
    }
    else {
      local_91c = nnz;
    }
    zerot = local_91c;
    info = nnz * nnz;
    nfact = 1;
    ifact = 0xb;
    register0x00000000 = singlecomplexCalloc((long)(local_91c * nnz));
    callocateA(nnz,info,&a_save,&asub_save,&xa_save);
  }
  else {
    ifact = 0;
    nfact = 0;
    creadhb(local_400,&info1,&nnz,&info,&a_save,&asub_save,&xa_save);
  }
  callocateA(nnz,info,(singlecomplex **)&asub,&xa,(int_t **)&A.Store);
  solx = singlecomplexMalloc((long)(info1 * relax));
  _ldx = singlecomplexMalloc((long)(info1 * relax));
  bsav = singlecomplexMalloc((long)(nnz * relax));
  rhsb = singlecomplexMalloc((long)(nnz * relax));
  if (nnz < info1) {
    local_920 = info1;
  }
  else {
    local_920 = nnz;
  }
  if (relax < 4) {
    local_928 = 4;
  }
  else {
    local_928 = relax;
  }
  work = singlecomplexCalloc((long)(local_920 * local_928));
  rpg = (float)info1;
  rcond = (float)nnz;
  cCreate_Dense_Matrix((SuperMatrix *)&X.Store,info1,relax,solx,info1,SLU_DN,SLU_C,SLU_GE);
  cCreate_Dense_Matrix((SuperMatrix *)&L.Store,nnz,relax,bsav,(int)rcond,SLU_DN,SLU_C,SLU_GE);
  zero = (singlecomplex)int32Malloc(nnz);
  perm_r_00 = int32Malloc(nnz);
  perm_c_00 = int32Malloc(nnz);
  addr = int32Malloc(nnz);
  C = (float *)superlu_malloc((long)info1 << 2);
  ferr = (float *)superlu_malloc((long)nnz << 2);
  berr = (float *)superlu_malloc((long)relax << 2);
  rwork = (float *)superlu_malloc((long)relax << 2);
  if (nnz < info1) {
    local_92c = info1;
  }
  else {
    local_92c = nnz;
  }
  if (relax < 4) {
    local_934 = 4;
  }
  else {
    local_934 = relax;
  }
  rowcnd = (float)(local_92c * local_934);
  wwork = (singlecomplex *)superlu_malloc((long)(int)rowcnd << 2);
  for (k1 = 0; k1 < (int)rowcnd; k1 = k1 + 1) {
    (&wwork->r)[k1] = 0.0;
  }
  if (C == (float *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R",0xc2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c")
    ;
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  if (ferr == (float *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C",0xc3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c")
    ;
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  if (berr == (float *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr",0xc4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c")
    ;
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  if (rwork == (float *)0x0) {
    sprintf(msg_4 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr",0xc5,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c")
    ;
    superlu_abort_and_exit(msg_4 + 0xf8);
  }
  if (wwork == (singlecomplex *)0x0) {
    sprintf(local_918,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0xc6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c")
    ;
    superlu_abort_and_exit(local_918);
  }
  for (k1 = 0; k1 < nnz; k1 = k1 + 1) {
    addr[k1] = k1;
    perm_c_00[k1] = k1;
  }
  options.Fact = 8;
  nimat = nfact;
  do {
    if (ifact < nimat) {
      PrintSumm("CGE",imat,nerrs,fimat);
      iVar1 = strcmp(main::matrix_type,"LA");
      if (iVar1 == 0) {
        superlu_free(stack0xfffffffffffffce0);
      }
      superlu_free(solx);
      superlu_free(_ldx);
      superlu_free(bsav);
      superlu_free(rhsb);
      superlu_free((void *)zero);
      superlu_free(perm_r_00);
      superlu_free(perm_c_00);
      superlu_free(addr);
      superlu_free(C);
      superlu_free(ferr);
      superlu_free(berr);
      superlu_free(rwork);
      superlu_free(wwork);
      superlu_free(work);
      Destroy_SuperMatrix_Store((SuperMatrix *)&X.Store);
      Destroy_SuperMatrix_Store((SuperMatrix *)&L.Store);
      superlu_free(a_save);
      superlu_free(asub_save);
      superlu_free(xa_save);
      superlu_free(asub);
      superlu_free(xa);
      superlu_free(A.Store);
      if (0 < local_258) {
        superlu_free(_panel_size);
        Destroy_SuperMatrix_Store((SuperMatrix *)&U.Store);
        Destroy_SuperMatrix_Store((SuperMatrix *)&ASAV.Store);
      }
      return (uint)(imat != 0);
    }
    if (nimat == 0) {
      u._4_4_ = nnz + 1;
      local_300 = 0;
LAB_00101e64:
      cCreate_CompCol_Matrix
                ((SuperMatrix *)&B.Store,info1,nnz,info,a_save,asub_save,xa_save,SLU_NC,SLU_C,SLU_GE
                );
      cCreate_CompCol_Matrix
                ((SuperMatrix *)&AC.Store,info1,nnz,info,(singlecomplex *)asub,xa,(int_t *)A.Store,
                 SLU_NC,SLU_C,SLU_GE);
      cCopy_CompCol_Matrix((SuperMatrix *)&B.Store,(SuperMatrix *)&AC.Store);
      cGenXtrue(nnz,relax,rhsb,(int)rcond);
      StatInit((SuperLUStat_t *)&fp);
      for (nrun = 0; nrun < 4; nrun = nrun + 1) {
        main::equed[0] = main::equeds[nrun];
        if (nrun == 0) {
          itran = 4;
        }
        else {
          itran = 1;
        }
        for (kl = 0; kl < itran; kl = kl + 1) {
          stat._36_4_ = main::facts[kl];
          trans = stat._36_4_;
          for (nt = 0; nt < 2; nt = nt + 1) {
            fact = nt;
            local_949 = trans == (CONJ|TRANS) || trans == CONJ;
            iequed = (int)local_949;
            cCopy_CompCol_Matrix((SuperMatrix *)&AC.Store,(SuperMatrix *)&B.Store);
            if (local_300 == 0) {
              if ((trans == (CONJ|TRANS)) && ((nt != 0 || (nrun != 0)))) {
                cgsequ((SuperMatrix *)&B.Store,C,ferr,&amax,(float *)&maxsuper,(float *)&rowblk,
                       &lwork);
                if ((xact._4_4_ == 0) && (0 < nnz)) {
                  iVar1 = strncmp(main::equed,"R",1);
                  if (iVar1 == 0) {
                    amax = 0.0;
                    maxsuper = 0x3f800000;
                  }
                  else {
                    iVar1 = strncmp(main::equed,"C",1);
                    if (iVar1 == 0) {
                      amax = 1.0;
                      maxsuper = 0;
                    }
                    else {
                      iVar1 = strncmp(main::equed,"B",1);
                      if (iVar1 == 0) {
                        amax = 0.0;
                        maxsuper = 0;
                      }
                    }
                  }
                }
                claqgs((SuperMatrix *)&B.Store,C,ferr,amax,(float)maxsuper,(float)rowblk,main::equed
                      );
              }
LAB_001021a4:
              if (iequed != 0) {
                stat._36_4_ = trans;
                trans = NOTRANS;
                sp_preorder((superlu_options_t *)&trans,(SuperMatrix *)&B.Store,perm_c_00,
                            (int *)zero,(SuperMatrix *)&Glu.stack.array);
                cgstrf((superlu_options_t *)&trans,(SuperMatrix *)&Glu.stack.array,n,m,(int *)zero,
                       _panel_size,local_258,perm_c_00,perm_r_00,(SuperMatrix *)&U.Store,
                       (SuperMatrix *)&ASAV.Store,(GlobalLU_t *)&mem_usage,(SuperLUStat_t *)&fp,
                       (int_t *)((long)&xact + 4));
                if ((xact._4_4_ != 0) &&
                   (printf("** First factor: info %lld, equed %c\n",(long)(int)xact._4_4_,
                           (ulong)(uint)(int)main::equed[0]), local_258 == -1)) {
                  printf("** Estimated memory: %lld bytes\n",(long)(int)xact._4_4_ - (long)nnz);
                  exit(0);
                }
                Destroy_CompCol_Permuted((SuperMatrix *)&Glu.stack.array);
                trans = stat._36_4_;
              }
              for (ku = 0; ku < 2; ku = ku + 1) {
                stat.expansions = main::transs[ku];
                options.Equil = stat.expansions;
                cCopy_CompCol_Matrix((SuperMatrix *)&AC.Store,(SuperMatrix *)&B.Store);
                cFillRHS(stat.expansions,relax,rhsb,(int)rcond,(SuperMatrix *)&B.Store,
                         (SuperMatrix *)&X.Store);
                cCopy_Dense_Matrix(info1,relax,solx,(int)rpg,_ldx,(int)rpg);
                if ((trans == NOTRANS) && (ku == 0)) {
                  cCopy_Dense_Matrix(info1,relax,solx,(int)rpg,bsav,(int)rcond);
                  B_00 = &L.Store;
                  stat_00 = (SuperLUStat_t *)&fp;
                  cgssv((superlu_options_t *)&trans,(SuperMatrix *)&B.Store,perm_c_00,perm_r_00,
                        (SuperMatrix *)&U.Store,(SuperMatrix *)&ASAV.Store,(SuperMatrix *)B_00,
                        stat_00,(int_t *)((long)&xact + 4));
                  if ((xact._4_4_ == 0) || (xact._4_4_ == u._4_4_)) {
                    cgst01(info1,u._4_4_ - 1,(SuperMatrix *)&B.Store,(SuperMatrix *)&U.Store,
                           (SuperMatrix *)&ASAV.Store,perm_c_00,perm_r_00,
                           (float *)&options.lookahead_etree);
                    nfail = 1;
                    if (u._4_4_ == nnz + 1U) {
                      cCopy_Dense_Matrix(info1,relax,solx,(int)rpg,(singlecomplex *)work,(int)rpg);
                      cgst02(stat.expansions,info1,nnz,relax,(SuperMatrix *)&B.Store,bsav,(int)rcond
                             ,(singlecomplex *)work,(int)rpg,(float *)&options.SymPattern);
                      nfail = 2;
                    }
                    for (k1 = 0; k1 < nfail; k1 = k1 + 1) {
                      if (20.0 <= result[(long)k1 + -2]) {
                        printf("%10s:n=%d, test(%d)=%12.5g\n",(double)result[(long)k1 + -2],"cgssv",
                               (ulong)(uint)nnz,(ulong)(uint)k1);
                        imat = imat + 1;
                      }
                    }
                    nerrs = nfail + nerrs;
                  }
                  else {
                    printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","cgssv",
                           (ulong)xact._4_4_,(ulong)u._4_4_,(ulong)(uint)nnz,(ulong)(uint)relax,
                           CONCAT44((int)((ulong)B_00 >> 0x20),nimat),
                           CONCAT44((int)((ulong)stat_00 >> 0x20),imat));
                  }
                  for (k1 = 0; k1 < nnz; k1 = k1 + 1) {
                    perm_c_00[k1] = addr[k1];
                  }
                  if (local_258 == 0) {
                    Destroy_SuperNode_Matrix((SuperMatrix *)&U.Store);
                    Destroy_CompCol_Matrix((SuperMatrix *)&ASAV.Store);
                  }
                }
                if ((trans == (CONJ|TRANS)) && (((nt != 0 || (nrun != 0)) && (0 < nnz)))) {
                  claqgs((SuperMatrix *)&B.Store,C,ferr,amax,(float)maxsuper,(float)rowblk,
                         main::equed);
                }
                pfVar3 = C;
                pfVar5 = ferr;
                cgssvx((superlu_options_t *)&trans,(SuperMatrix *)&B.Store,perm_c_00,perm_r_00,
                       (int *)zero,main::equed,C,ferr,(SuperMatrix *)&U.Store,
                       (SuperMatrix *)&ASAV.Store,_panel_size,local_258,(SuperMatrix *)&X.Store,
                       (SuperMatrix *)&L.Store,(float *)&i,(float *)&j,berr,rwork,
                       (GlobalLU_t *)&mem_usage,(mem_usage_t *)&perm_r,(SuperLUStat_t *)&fp,
                       (int_t *)((long)&xact + 4));
                if ((xact._4_4_ == 0) || (xact._4_4_ == u._4_4_)) {
                  bVar2 = iequed != 0;
                  if (!bVar2) {
                    cgst01(info1,u._4_4_ - 1,(SuperMatrix *)&B.Store,(SuperMatrix *)&U.Store,
                           (SuperMatrix *)&ASAV.Store,perm_c_00,perm_r_00,
                           (float *)&options.lookahead_etree);
                  }
                  colcnd = (float)(uint)bVar2;
                  if (xact._4_4_ == 0) {
                    cCopy_Dense_Matrix(info1,relax,_ldx,(int)rpg,(singlecomplex *)work,(int)rpg);
                    pvVar6 = work;
                    cgst02(stat.expansions,info1,nnz,relax,(SuperMatrix *)&AC.Store,bsav,(int)rcond,
                           (singlecomplex *)work,(int)rpg,(float *)&options.SymPattern);
                    uVar8 = (undefined4)((ulong)pvVar6 >> 0x20);
                    cgst04(nnz,relax,bsav,(int)rcond,rhsb,(int)rcond,(float)j,result);
                    uVar7 = CONCAT44(uVar8,rcond);
                    psVar4 = bsav;
                    cgst07(stat.expansions,nnz,relax,(SuperMatrix *)&AC.Store,_ldx,(int)rpg,bsav,
                           (int)rcond,rhsb,(int)rcond,berr,rwork,result + 1);
                    for (k1 = (int)colcnd; k1 < 5; k1 = k1 + 1) {
                      if (20.0 <= result[(long)k1 + -2]) {
                        psVar4 = (singlecomplex *)CONCAT44((int)((ulong)psVar4 >> 0x20),nimat);
                        uVar7 = CONCAT44((int)((ulong)uVar7 >> 0x20),k1);
                        printf("%10s:fact=%4d, trans=%4d, equed=%c, n=%d, imat=%d, test(%d)=%12.5g\n"
                               ,(double)result[(long)k1 + -2],"cgssvx",(ulong)trans,
                               (ulong)(uint)stat.expansions,(ulong)(uint)(int)main::equed[0],
                               (ulong)(uint)nnz,psVar4,uVar7);
                        imat = imat + 1;
                      }
                    }
                    nerrs = nerrs + 5;
                  }
                }
                else {
                  printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","cgssvx",
                         (ulong)xact._4_4_,(ulong)u._4_4_,(ulong)(uint)nnz,(ulong)(uint)relax,
                         CONCAT44((int)((ulong)pfVar3 >> 0x20),nimat),
                         CONCAT44((int)((ulong)pfVar5 >> 0x20),imat));
                  if (local_258 == -1) {
                    printf("** Estimated memory: %.0f bytes\n",(double)perm_r._4_4_);
                    exit(0);
                  }
                }
              }
              if (local_258 == 0) {
                Destroy_SuperNode_Matrix((SuperMatrix *)&U.Store);
                Destroy_CompCol_Matrix((SuperMatrix *)&ASAV.Store);
              }
            }
            else if (iequed == 0) goto LAB_001021a4;
          }
        }
      }
      Destroy_SuperMatrix_Store((SuperMatrix *)&B.Store);
      Destroy_SuperMatrix_Store((SuperMatrix *)&AC.Store);
      StatFree((SuperLUStat_t *)&fp);
    }
    else {
      local_935 = 4 < nimat && nimat < 8;
      local_300 = (uint)local_935;
      if ((local_300 == 0) || (nimat + -4 <= nnz)) {
        clatb4_slu(main::path,&nimat,&nnz,&nnz,main::sym,&mode,&lda,(float *)((long)&Afull + 4),
                   &ioff,(float *)&Afull,main::dist);
        mode_00 = &ioff;
        cond = &Afull;
        clatms_slu(&nnz,&nnz,main::dist,(int *)(msg + 0xf8),main::sym,&wwork->r,mode_00,
                   (float *)cond,(float *)((long)&Afull + 4),&mode,&lda,"No packing",
                   stack0xfffffffffffffce0,&zerot,(singlecomplex *)work,&lwork);
        if (lwork == 0) {
          if (local_300 == 0) {
            u._4_4_ = nnz + 1;
          }
          else {
            if (nimat == 5) {
              u._4_4_ = 1;
            }
            else if (nimat == 6) {
              u._4_4_ = nnz;
            }
            else {
              u._4_4_ = nnz / 2 + 1;
            }
            izero = (u._4_4_ - 1) * zerot;
            if (nimat < 7) {
              for (k1 = 0; k1 < nnz; k1 = k1 + 1) {
                stack0xfffffffffffffce0[izero + k1] = (singlecomplex)R;
              }
            }
            else {
              for (rowcnd = 0.0; (int)rowcnd < (int)((nnz - u._4_4_) + 1);
                  rowcnd = (float)((int)rowcnd + 1)) {
                for (k1 = 0; k1 < nnz; k1 = k1 + 1) {
                  stack0xfffffffffffffce0[izero + k1 + (int)rowcnd * zerot] = (singlecomplex)R;
                }
              }
            }
          }
          sp_cconvert(nnz,nnz,stack0xfffffffffffffce0,zerot,mode,lda,a_save,asub_save,xa_save,&info)
          ;
          goto LAB_00101e64;
        }
        printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","CLATMS",
               (ulong)(uint)lwork,(ulong)u._4_4_,(ulong)(uint)nnz,(ulong)(uint)relax,
               CONCAT44((int)((ulong)mode_00 >> 0x20),nimat),
               CONCAT44((int)((ulong)cond >> 0x20),imat));
      }
    }
    nimat = nimat + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    singlecomplex         *a, *a_save;
    int_t          *asub, *asub_save;
    int_t          *xa, *xa_save;
    SuperMatrix  A, B, X, L, U;
    SuperMatrix  ASAV, AC;
    GlobalLU_t   Glu; /* Not needed on return. */
    mem_usage_t    mem_usage;
    int            *perm_r; /* row permutation from partial pivoting */
    int            *perm_c, *pc_save; /* column permutation */
    int            *etree;
    singlecomplex  zero = {0.0, 0.0};
    float         *R, *C;
    float         *ferr, *berr;
    float         *rwork;
    singlecomplex	   *wwork;
    void           *work = NULL;
    int            nrhs, panel_size, relax;
    int            m, n, info1;
    int_t          nnz, lwork, info;
    singlecomplex         *xact;
    singlecomplex         *rhsb, *solx, *bsav;
    int            ldb, ldx;
    float         rpg, rcond;
    int            i, j, k1;
    float         rowcnd, colcnd, amax;
    int            maxsuper, rowblk, colblk;
    int            prefact, equil, iequed;
    int            nt, nrun, nfail, nerrs, imat, fimat, nimat;
    int            nfact, ifact, itran;
    int            kl, ku, mode, lda, ioff;
    int            zerot; /* indicate whether the matrix is singular */
    int            izero; /* indicate the first column that is entirely zero */
    double         u;
    float         anorm, cndnum;
    singlecomplex         *Afull;
    float         result[NTESTS];
    superlu_options_t options;
    fact_t         fact;
    trans_t        trans;
    SuperLUStat_t  stat;
    static char    matrix_type[8];
    static char    equed[1], path[4], sym[1], dist[1];
    FILE           *fp;

    /* Fixed set of parameters */
    int            iseed[]  = {1988, 1989, 1990, 1991};
    static char    equeds[]  = {'N', 'R', 'C', 'B'};
    static fact_t  facts[] = {FACTORED, DOFACT, SamePattern,
			      SamePattern_SameRowPerm};
    static trans_t transs[]  = {NOTRANS, TRANS, CONJ};

    /* Some function prototypes */ 
    extern int cgst01(int, int, SuperMatrix *, SuperMatrix *, 
		      SuperMatrix *, int *, int *, float *);
    extern int cgst02(trans_t, int, int, int, SuperMatrix *, singlecomplex *,
                      int, singlecomplex *, int, float *resid);
    extern int cgst04(int, int, singlecomplex *, int, 
                      singlecomplex *, int, float rcond, float *resid);
    extern int cgst07(trans_t, int, int, SuperMatrix *, singlecomplex *, int,
                         singlecomplex *, int, singlecomplex *, int, 
                         float *, float *, float *);
    extern int clatb4_slu(char *, int *, int *, int *, char *, int *, int *, 
	               float *, int *, float *, char *);
    extern int clatms_slu(int *, int *, char *, int *, char *, float *d,
                       int *, float *, float *, int *, int *,
                       char *, singlecomplex *, int *, singlecomplex *, int *);
    extern int sp_cconvert(int, int, singlecomplex *, int, int, int,
	                   singlecomplex *a, int_t *, int_t *, int_t *);


    /* Executable statements */

    strcpy(path, "CGE");
    nrun  = 0;
    nfail = 0;
    nerrs = 0;

    /* Defaults */
    lwork      = 0;
    n          = 1;
    nrhs       = 1;
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);
    u          = 1.0;
    strcpy(matrix_type, "LA");
    parse_command_line(argc, argv, matrix_type, &n,
		       &panel_size, &relax, &nrhs, &maxsuper,
		       &rowblk, &colblk, &lwork, &u, &fp);
    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    fprintf(stderr, "expert: cannot allocate %lld bytes\n", (long long) lwork);
	    exit (-1);
	}
    }

    /* Set the default input options. */
    set_default_options(&options);
    options.DiagPivotThresh = u;
    options.PrintStat = NO;
    options.PivotGrowth = YES;
    options.ConditionNumber = YES;
    options.IterRefine = SLU_SINGLE;
    
    if ( strcmp(matrix_type, "LA") == 0 ) {
	/* Test LAPACK matrix suite. */
	m = n;
	lda = SUPERLU_MAX(n, 1);
	nnz = n * n;        /* upper bound */
	fimat = 1;
	nimat = NTYPES;
	Afull = singlecomplexCalloc(lda * n);
	callocateA(n, nnz, &a, &asub, &xa);
    } else {
	/* Read a sparse matrix */
	fimat = nimat = 0;
	creadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    }

    callocateA(n, nnz, &a_save, &asub_save, &xa_save);
    rhsb = singlecomplexMalloc(m * nrhs);
    bsav = singlecomplexMalloc(m * nrhs);
    solx = singlecomplexMalloc(n * nrhs);
    xact = singlecomplexMalloc(n * nrhs);
    wwork = singlecomplexCalloc( SUPERLU_MAX(m,n) * SUPERLU_MAX(4,nrhs) );

    ldb  = m;
    ldx  = n;
    cCreate_Dense_Matrix(&B, m, nrhs, rhsb, ldb, SLU_DN, SLU_C, SLU_GE);
    cCreate_Dense_Matrix(&X, n, nrhs, solx, ldx, SLU_DN, SLU_C, SLU_GE);
    etree   = int32Malloc(n);
    perm_r  = int32Malloc(n);
    perm_c  = int32Malloc(n);
    pc_save = int32Malloc(n);
    R       = (float *) SUPERLU_MALLOC(m*sizeof(float));
    C       = (float *) SUPERLU_MALLOC(n*sizeof(float));
    ferr    = (float *) SUPERLU_MALLOC(nrhs*sizeof(float));
    berr    = (float *) SUPERLU_MALLOC(nrhs*sizeof(float));
    j = SUPERLU_MAX(m,n) * SUPERLU_MAX(4,nrhs);    
    rwork   = (float *) SUPERLU_MALLOC(j*sizeof(float));
    for (i = 0; i < j; ++i) rwork[i] = 0.;
    if ( !R ) ABORT("SUPERLU_MALLOC fails for R");
    if ( !C ) ABORT("SUPERLU_MALLOC fails for C");
    if ( !ferr ) ABORT("SUPERLU_MALLOC fails for ferr");
    if ( !berr ) ABORT("SUPERLU_MALLOC fails for berr");
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");

    for (i = 0; i < n; ++i) perm_c[i] = pc_save[i] = i;
    options.ColPerm = MY_PERMC;

    for (imat = fimat; imat <= nimat; ++imat) { /* All matrix types */
	
	if ( imat ) {

	    /* Skip types 5, 6, or 7 if the matrix size is too small. */
	    zerot = (imat >= 5 && imat <= 7);
	    if ( zerot && n < imat-4 )
		continue;
	    
	    /* Set up parameters with CLATB4 and generate a test matrix
	       with CLATMS.  */
	    clatb4_slu(path, &imat, &n, &n, sym, &kl, &ku, &anorm, &mode,
		    &cndnum, dist);

	    clatms_slu(&n, &n, dist, iseed, sym, &rwork[0], &mode, &cndnum,
		    &anorm, &kl, &ku, "No packing", Afull, &lda,
		    &wwork[0], &info1);

	    if ( info1 ) {
		printf(FMT3, "CLATMS", info1, izero, n, nrhs, imat, nfail);
		continue;
	    }

	    /* For types 5-7, zero one or more columns of the matrix
	       to test that INFO is returned correctly.   */
	    if ( zerot ) {
		if ( imat == 5 ) izero = 1;
		else if ( imat == 6 ) izero = n;
		else izero = n / 2 + 1;
		ioff = (izero - 1) * lda;
		if ( imat < 7 ) {
		    for (i = 0; i < n; ++i) Afull[ioff + i] = zero;
		} else {
		    for (j = 0; j < n - izero + 1; ++j)
			for (i = 0; i < n; ++i)
			    Afull[ioff + i + j*lda] = zero;
		}
	    } else {
		izero = n+1; /* none of the column is zero */
	    }

	    /* Convert to sparse representation. */
	    sp_cconvert(n, n, Afull, lda, kl, ku, a, asub, xa, &nnz);

	} else {
	    izero = n+1; /* none of the column is zero */
	    zerot = 0;
	}
	
	cCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_C, SLU_GE);

	/* Save a copy of matrix A in ASAV */
	cCreate_CompCol_Matrix(&ASAV, m, n, nnz, a_save, asub_save, xa_save,
			      SLU_NC, SLU_C, SLU_GE);
	cCopy_CompCol_Matrix(&A, &ASAV);
	
	/* Form exact solution. */
	cGenXtrue(n, nrhs, xact, ldx);
	
	StatInit(&stat);

	for (iequed = 0; iequed < 4; ++iequed) {
	    *equed = equeds[iequed];
	    if (iequed == 0) nfact = 4;
	    else nfact = 1; /* Only test factored, pre-equilibrated matrix */

	    for (ifact = 0; ifact < nfact; ++ifact) {
		fact = facts[ifact];
		options.Fact = fact;

		for (equil = 0; equil < 2; ++equil) {
		    options.Equil = equil;
		    prefact   = ( options.Fact == FACTORED ||
				  options.Fact == SamePattern_SameRowPerm );
                                /* Need a first factor */

		    /* Restore the matrix A. */
		    cCopy_CompCol_Matrix(&ASAV, &A);
			
		    if ( zerot ) {
                        if ( prefact ) continue;
		    } else if ( options.Fact == FACTORED ) {
                        if ( equil || iequed ) {
			    /* Compute row and column scale factors to
			       equilibrate matrix A.    */
			    cgsequ(&A, R, C, &rowcnd, &colcnd, &amax, &info1);

			    /* Force equilibration. */
			    if ( !info && n > 0 ) {
				if ( strncmp(equed, "R", 1)==0 ) {
				    rowcnd = 0.;
				    colcnd = 1.;
				} else if ( strncmp(equed, "C", 1)==0 ) {
				    rowcnd = 1.;
				    colcnd = 0.;
				} else if ( strncmp(equed, "B", 1)==0 ) {
				    rowcnd = 0.;
				    colcnd = 0.;
				}
			    }
			
			    /* Equilibrate the matrix. */
			    claqgs(&A, R, C, rowcnd, colcnd, amax, equed);
			}
		    }
		    
		    if ( prefact ) { /* Need a factor for the first time */
			
		        /* Save Fact option. */
		        fact = options.Fact;
			options.Fact = DOFACT;

			/* Preorder the matrix, obtain the column etree. */
			sp_preorder(&options, &A, perm_c, etree, &AC);

			/* Factor the matrix AC. */
			cgstrf(&options, &AC, relax, panel_size,
                               etree, work, lwork, perm_c, perm_r, &L, &U,
                               &Glu, &stat, &info);

			if ( info ) { 
                            printf("** First factor: info %lld, equed %c\n",
				   (long long) info, *equed);
                            if ( lwork == -1 ) {
                                printf("** Estimated memory: %lld bytes\n",
                                        (long long) info - n);
                                exit(0);
                            }
                        }
	
                        Destroy_CompCol_Permuted(&AC);
			
		        /* Restore Fact option. */
			options.Fact = fact;
		    } /* if .. first time factor */
		    
		    for (itran = 0; itran < NTRAN; ++itran) {
			trans = transs[itran];
                        options.Trans = trans;

			/* Restore the matrix A. */
			cCopy_CompCol_Matrix(&ASAV, &A);
			
 			/* Set the right hand side. */
			cFillRHS(trans, nrhs, xact, ldx, &A, &B);
			cCopy_Dense_Matrix(m, nrhs, rhsb, ldb, bsav, ldb);

			/*----------------
			 * Test cgssv
			 *----------------*/
			if ( options.Fact == DOFACT && itran == 0) {
                            /* Not yet factored, and untransposed */
	
			    cCopy_Dense_Matrix(m, nrhs, rhsb, ldb, solx, ldx);
			    cgssv(&options, &A, perm_c, perm_r, &L, &U, &X,
                                  &stat, &info);
			    
			    if ( info && info != izero ) {
                                printf(FMT3, "cgssv",
				       (int) info, izero, n, nrhs, imat, nfail);
			    } else {
                                /* Reconstruct matrix from factors and compute residual.
				 * Only compute the leading 'izero' nonzero columns.
				 */
                                cgst01(m, izero-1, &A, &L, &U, perm_c, perm_r,
                                         &result[0]);
				nt = 1;
				if ( izero == (n+1) ) {
				    /* Compute residual of the computed
				       solution. */
				    cCopy_Dense_Matrix(m, nrhs, rhsb, ldb,
						       wwork, ldb);
				    cgst02(trans, m, n, nrhs, &A, solx,
                                              ldx, wwork,ldb, &result[1]);
				    nt = 2;
				}
				
				/* Print information about the tests that
				   did not pass the threshold.      */
				for (i = 0; i < nt; ++i) {
				    if ( result[i] >= THRESH ) {
					printf(FMT1, "cgssv", n, i,
					       result[i]);
					++nfail;
				    }
				}
				nrun += nt;
			    } /* else .. info == 0 */

			    /* Restore perm_c. */
			    for (i = 0; i < n; ++i) perm_c[i] = pc_save[i];

		            if (lwork == 0) {
			        Destroy_SuperNode_Matrix(&L);
			        Destroy_CompCol_Matrix(&U);
			    }
			} /* if .. end of testing cgssv */
    
			/*----------------
			 * Test cgssvx
			 *----------------*/
    
			/* Equilibrate the matrix if fact = FACTORED and
			   equed = 'R', 'C', or 'B'.   */
			if ( options.Fact == FACTORED &&
			     (equil || iequed) && n > 0 ) {
			    claqgs(&A, R, C, rowcnd, colcnd, amax, equed);
			}
			
			/* Solve the system and compute the condition number
			   and error bounds using cgssvx.      */
			cgssvx(&options, &A, perm_c, perm_r, etree,
                               equed, R, C, &L, &U, work, lwork, &B, &X, &rpg,
                               &rcond, ferr, berr, &Glu,
			       &mem_usage, &stat, &info);

			if ( info && info != izero ) {
			    printf(FMT3, "cgssvx",
				   (int) info, izero, n, nrhs, imat, nfail);
                            if ( lwork == -1 ) {
                                printf("** Estimated memory: %.0f bytes\n",
                                        mem_usage.total_needed);
                                exit(0);
                            }
			} else {
			    if ( !prefact ) {
			    	/* Reconstruct matrix from factors and compute residual.
				 * Only compute the leading 'izero' nonzero columns.
				 */
                                cgst01(m, izero-1, &A, &L, &U, perm_c, perm_r,
                                         &result[0]);
				k1 = 0;
			    } else {
			   	k1 = 1;
			    }

			    if ( !info ) {
				/* Compute residual of the computed solution.*/
				cCopy_Dense_Matrix(m, nrhs, bsav, ldb,
						  wwork, ldb);
				cgst02(trans, m, n, nrhs, &ASAV, solx, ldx,
					  wwork, ldb, &result[1]);

				/* Check solution from generated exact
				   solution. */
				cgst04(n, nrhs, solx, ldx, xact, ldx, rcond,
					  &result[2]);

				/* Check the error bounds from iterative
				   refinement. */
				cgst07(trans, n, nrhs, &ASAV, bsav, ldb,
					  solx, ldx, xact, ldx, ferr, berr,
					  &result[3]);

				/* Print information about the tests that did
				   not pass the threshold.    */
				for (i = k1; i < NTESTS; ++i) {
				    if ( result[i] >= THRESH ) {
					printf(FMT2, "cgssvx",
					       options.Fact, trans, *equed,
					       n, imat, i, result[i]);
					++nfail;
				    }
				}
				nrun += NTESTS;
			    } /* if .. info == 0 */
			} /* else .. end of testing cgssvx */

		    } /* for itran ... */

		    if ( lwork == 0 ) {
			Destroy_SuperNode_Matrix(&L);
			Destroy_CompCol_Matrix(&U);
		    }

		} /* for equil ... */
	    } /* for ifact ... */
	} /* for iequed ... */
#if 0    
    if ( !info ) {
	PrintPerf(&L, &U, &mem_usage, rpg, rcond, ferr, berr, equed);
    }
#endif
        Destroy_SuperMatrix_Store(&A);
        Destroy_SuperMatrix_Store(&ASAV);
        StatFree(&stat);

    } /* for imat ... */

    /* Print a summary of the results. */
    PrintSumm("CGE", nfail, nrun, nerrs);

    if ( strcmp(matrix_type, "LA") == 0 ) SUPERLU_FREE (Afull);
    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (bsav);
    SUPERLU_FREE (solx);    
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (pc_save);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    SUPERLU_FREE (rwork);
    SUPERLU_FREE (wwork);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
#if 0
    Destroy_CompCol_Matrix(&A);
    Destroy_CompCol_Matrix(&ASAV);
#else
    SUPERLU_FREE(a); SUPERLU_FREE(asub); SUPERLU_FREE(xa);
    SUPERLU_FREE(a_save); SUPERLU_FREE(asub_save); SUPERLU_FREE(xa_save);
#endif
    if ( lwork > 0 ) {
	SUPERLU_FREE (work);
	Destroy_SuperMatrix_Store(&L);
	Destroy_SuperMatrix_Store(&U);
    }

    return (nfail == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}